

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O3

void Omega_h::project_classification
               (Mesh *mesh,Int ent_dim,Write<signed_char> *class_dim,Write<int> *class_id,
               bool relaxed)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  Alloc *this;
  Alloc *this_00;
  Alloc *pAVar6;
  Alloc *pAVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  LO LVar11;
  int iVar12;
  uint to;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  undefined1 uVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  IntIterator last;
  Read<int> high_class_id;
  Read<signed_char> high_class_dim;
  LOs lh2h;
  LOs l2lh;
  type f;
  Adj l2h;
  Alloc *local_208;
  element_type *local_200;
  undefined1 local_1f8 [56];
  element_type *local_1c0;
  Alloc *local_1b8;
  element_type *local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  Alloc *local_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  Alloc *local_178;
  Alloc *local_170;
  Alloc *local_168;
  Alloc *local_160;
  Alloc *local_158;
  element_type *local_150;
  Alloc *local_148;
  element_type *local_140;
  Alloc *local_138;
  element_type *peStack_130;
  Alloc *local_128;
  element_type *peStack_120;
  Alloc *local_118;
  element_type *peStack_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  element_type *peStack_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  element_type *peStack_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  element_type *peStack_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  element_type *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *local_70;
  undefined4 local_68;
  int iStack_64;
  Adj local_60;
  
  to = ent_dim + 1;
  Mesh::ask_up(&local_60,mesh,ent_dim,to);
  local_148 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar7 = local_148;
  local_140 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_158 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar6 = local_158;
  local_150 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_208 = (Alloc *)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_190,(Int)mesh,(string *)(ulong)to);
  if (local_208 != (Alloc *)local_1f8) {
    operator_delete(local_208,(ulong)((long)(size_t *)local_1f8._0_8_ + 1));
  }
  local_208 = (Alloc *)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"class_id","");
  Mesh::get_array<int>((Mesh *)&local_1a0,(Int)mesh,(string *)(ulong)to);
  if (local_208 != (Alloc *)local_1f8) {
    operator_delete(local_208,(ulong)((long)(size_t *)local_1f8._0_8_ + 1));
  }
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(class_dim->shared_alloc_).alloc;
  if (((ulong)local_c8._M_pi & 7) == 0 && (Alloc *)local_c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_c8._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_c8._M_pi)->use_count = ((Alloc *)local_c8._M_pi)->use_count + 1;
    }
  }
  _Var8._M_pi = local_c8._M_pi;
  peVar4 = (element_type *)(class_dim->shared_alloc_).direct_ptr;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(class_id->shared_alloc_).alloc;
  if (((ulong)local_b8._M_pi & 7) == 0 && (Alloc *)local_b8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_b8._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_b8._M_pi)->use_count = ((Alloc *)local_b8._M_pi)->use_count + 1;
    }
  }
  peVar5 = (element_type *)(class_id->shared_alloc_).direct_ptr;
  bVar22 = ((ulong)pAVar7 & 7) == 0;
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar7;
  if (bVar22 && pAVar7 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pAVar7->size * 8 + 1);
    }
    else {
      pAVar7->use_count = pAVar7->use_count + 1;
    }
  }
  local_a0 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  bVar23 = ((ulong)pAVar6 & 7) == 0;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar6;
  if (bVar23 && pAVar6 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pAVar6->size * 8 + 1);
    }
    else {
      pAVar6->use_count = pAVar6->use_count + 1;
    }
  }
  local_90 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_88._M_pi = local_190._M_pi;
  if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_190._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  _Var9._M_pi = local_88._M_pi;
  local_80 = local_188;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  _Var10._M_pi = local_78._M_pi;
  local_70 = local_198;
  local_68 = CONCAT31(local_68._1_3_,relaxed);
  local_180._M_pi = local_98._M_pi;
  local_178 = (Alloc *)local_a8._M_pi;
  local_170 = (Alloc *)local_b8._M_pi;
  local_168 = pAVar6;
  local_160 = pAVar7;
  local_c0 = peVar4;
  local_b0 = peVar5;
  iStack_64 = ent_dim;
  LVar11 = Mesh::nents(mesh,ent_dim);
  local_138 = (Alloc *)_Var8._M_pi;
  if (((ulong)_Var8._M_pi & 7) == 0 && (Alloc *)_Var8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((long)(_Var8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_128 = local_170;
  if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_170->size * 8 + 1);
    }
    else {
      local_170->use_count = local_170->use_count + 1;
    }
  }
  local_118 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  peStack_110 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_108._M_pi = local_180._M_pi;
  if (((ulong)local_180._M_pi & 7) == 0 && (Alloc *)local_180._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_180._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_180._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_180._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_100 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_f8._M_pi = _Var9._M_pi;
  if (((ulong)_Var9._M_pi & 7) == 0 && (Alloc *)_Var9._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(_Var9._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var9._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var9._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_f0 = local_188;
  local_e8._M_pi = _Var10._M_pi;
  if (((ulong)_Var10._M_pi & 7) == 0 && (Alloc *)_Var10._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(_Var10._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var10._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var10._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_e0 = local_198;
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(iStack_64,local_68);
  peStack_130 = peVar4;
  peStack_120 = peVar5;
  if (0 < LVar11) {
    local_208 = local_138;
    if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
      local_138->use_count = local_138->use_count + -1;
      local_208 = (Alloc *)(local_138->size * 8 + 1);
    }
    local_138 = (Alloc *)0x0;
    peStack_130 = (element_type *)0x0;
    local_1f8._0_8_ = local_128;
    if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
      local_128->use_count = local_128->use_count + -1;
      local_1f8._0_8_ = local_128->size * 8 + 1;
    }
    local_128 = (Alloc *)0x0;
    peStack_120 = (element_type *)0x0;
    local_1f8._24_8_ = local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_1f8._16_8_ = local_118;
    if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
      local_118->use_count = local_118->use_count + -1;
      local_1f8._16_8_ = local_118->size * 8 + 1;
    }
    local_118 = (Alloc *)0x0;
    peStack_110 = (element_type *)0x0;
    local_1f8._40_8_ = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_1f8._32_8_ = local_108._M_pi;
    if (((ulong)local_108._M_pi & 7) == 0 && (Alloc *)local_108._M_pi != (Alloc *)0x0) {
      *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base + -1;
      local_1f8._32_8_ = (long)(local_108._M_pi)->_vptr__Sp_counted_base * 8 + 1;
    }
    local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_100 = (element_type *)0x0;
    local_1c0 = local_188;
    local_1f8._48_8_ = local_f8._M_pi;
    if (((ulong)local_f8._M_pi & 7) == 0 && (Alloc *)local_f8._M_pi != (Alloc *)0x0) {
      *(int *)&local_f8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_f8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_1f8._48_8_ = (long)(local_f8._M_pi)->_vptr__Sp_counted_base * 8 + 1;
    }
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_f0 = (element_type *)0x0;
    local_1b8 = (Alloc *)local_e8._M_pi;
    local_1b0 = local_198;
    if (((ulong)local_e8._M_pi & 7) == 0 && (Alloc *)local_e8._M_pi != (Alloc *)0x0) {
      *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_1b8 = (Alloc *)((long)(local_e8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_e0 = (element_type *)0x0;
    entering_parallel = '\0';
    iVar12 = iStack_64 + 1;
    lVar15 = 0;
    do {
      iVar14 = (int)*(char *)((long)&(peVar4->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar15)
      ;
      iVar13 = *(int *)((long)&(peVar5->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar15 * 4);
      iVar16 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                               ->a2ab).write_.shared_alloc_.alloc + lVar15 * 4);
      lVar17 = (long)iVar16;
      iVar3 = *(int *)((long)&(((Graph *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                              ->a2ab).write_.shared_alloc_.alloc + lVar15 * 4 + 4);
      if (iVar16 < iVar3) {
        iVar21 = 0;
        do {
          lVar20 = (long)*(int *)((long)&(((Graph *)
                                          local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)
                                         ->a2ab).write_.shared_alloc_.alloc + lVar17 * 4);
          iVar18 = (int)*(char *)((long)&local_188->library_ + lVar20);
          iVar16 = *(int *)((long)&(((Graph *)&local_198->library_)->a2ab).write_.shared_alloc_.
                                   alloc + lVar20 * 4);
          if (iVar18 < iVar14) {
            iVar21 = 1;
            iVar14 = iVar18;
            iVar13 = iVar16;
          }
          else if (iVar14 == iVar18) {
            if ((iVar16 == -1 & (byte)local_68) == 0 && iVar16 != iVar13) {
              if (iVar13 == -1) {
                iVar21 = iVar21 + 1;
                iVar13 = iVar16;
              }
              else {
                iVar14 = iVar14 + -1;
                iVar13 = -1;
                iVar21 = 0;
              }
            }
            else {
              iVar21 = iVar21 + 1;
            }
          }
          lVar17 = lVar17 + 1;
        } while (iVar3 != lVar17);
        uVar19 = (char)iVar14;
        iVar16 = iVar13;
        if (((iVar21 != 2) && (uVar19 = (char)iStack_64, iVar16 = -1, iVar14 != iVar12)) &&
           (uVar19 = (char)iVar14, iVar16 = iVar13, iVar21 < 2)) {
LAB_0024945d:
          if (iVar12 < iVar14) {
            iVar14 = iStack_64;
            iVar13 = -1;
          }
          uVar19 = (char)iVar14;
          iVar16 = iVar13;
        }
      }
      else {
        uVar19 = (char)iStack_64;
        iVar16 = -1;
        if (iVar12 != iVar14) goto LAB_0024945d;
      }
      *(undefined1 *)((long)&(peVar4->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar15) =
           uVar19;
      *(int *)((long)&(peVar5->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar15 * 4) = iVar16;
      lVar15 = lVar15 + 1;
    } while (LVar11 != (int)lVar15);
    local_200 = peVar4;
    local_1f8._8_8_ = peVar5;
    local_1a8 = local_d8._M_pi;
    project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)
    ::$_0::~__0((__0 *)&local_208);
  }
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&local_138);
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&local_c8);
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    piVar1 = &local_1a0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a0);
      operator_delete(local_1a0,0x48);
    }
  }
  this_00 = local_160;
  this = local_168;
  if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
    p_Var2 = local_190._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_190._M_pi);
      operator_delete(local_190._M_pi,0x48);
    }
  }
  if (bVar23 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (bVar22 && pAVar7 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void project_classification(Mesh* mesh, Int ent_dim, Write<I8> class_dim,
    Write<ClassId> class_id, bool relaxed) {
  auto l2h = mesh->ask_up(ent_dim, ent_dim + 1);
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto high_class_dim = mesh->get_array<I8>(ent_dim + 1, "class_dim");
  auto high_class_id = mesh->get_array<ClassId>(ent_dim + 1, "class_id");
  auto f = OMEGA_H_LAMBDA(LO l) {
    Int best_dim = class_dim[l];
    auto best_id = class_id[l];
    Int nadj = 0;
    for (auto lh = l2lh[l]; lh < l2lh[l + 1]; ++lh) {
      auto h = lh2h[lh];
      Int high_dim = high_class_dim[h];
      auto high_id = high_class_id[h];
      if (high_dim < best_dim) {
        best_dim = high_dim;
        best_id = high_id;
        nadj = 1;
      } else if (high_dim == best_dim) {
        if (high_id != best_id && (!relaxed || high_id != -1)) {
          if (best_id == -1) {
            best_id = high_id;
            ++nadj;
          } else {
            --best_dim;
            best_id = -1;
            nadj = 0;
          }
        } else {
          ++nadj;
        }
      }
    }
    if ((nadj != 2 && best_dim == ent_dim + 1) ||
        (nadj < 2 && best_dim > ent_dim + 1)) {
      best_dim = ent_dim;
      best_id = -1;
    }
    class_dim[l] = static_cast<I8>(best_dim);
    class_id[l] = best_id;
  };
  parallel_for(mesh->nents(ent_dim), f, "project_classification");
}